

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DCase::generateIterations
          (TextureGather2DCase *this)

{
  GatherType gatherType;
  pointer pGVar1;
  pointer pGVar2;
  undefined1 local_40 [16];
  _Alloc_hider _Stack_30;
  pointer local_28;
  
  gatherType = (this->super_TextureGatherCase).m_gatherType;
  TextureGatherCase::getOffsetRange((TextureGatherCase *)local_40);
  generateBasic2DCaseIterations
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
              *)(local_40 + 8),gatherType,
             (TextureFormat *)(ulong)(this->super_TextureGatherCase).m_textureFormat.order,
             (IVec2 *)local_40);
  pGVar1 = (this->m_iterations).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar2 = (this->m_iterations).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_iterations).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_40._8_8_;
  (this->m_iterations).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_30._M_p;
  (this->m_iterations).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_28;
  if (pGVar1 != (pointer)0x0) {
    operator_delete(pGVar1,(long)pGVar2 - (long)pGVar1);
    return;
  }
  return;
}

Assistant:

void TextureGather2DCase::generateIterations (void)
{
	DE_ASSERT(m_iterations.empty());
	m_iterations = generateBasic2DCaseIterations(m_gatherType, m_textureFormat, getOffsetRange());
}